

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimCreator.cpp
# Opt level: O0

void __thiscall
OpenMD::SimCreator::loadCoordinates(SimCreator *this,SimInfo *info,string *mdFileName)

{
  int iVar1;
  undefined8 uVar2;
  DumpReader *this_00;
  SimInfo *in_RSI;
  int nframes;
  DumpReader reader;
  DumpReader *in_stack_ffffffffffffed60;
  int in_stack_ffffffffffffedec;
  DumpReader *in_stack_ffffffffffffedf0;
  string *in_stack_ffffffffffffefb0;
  SimInfo *in_stack_ffffffffffffefb8;
  DumpReader *in_stack_ffffffffffffefc0;
  
  DumpReader::DumpReader
            (in_stack_ffffffffffffefc0,in_stack_ffffffffffffefb8,in_stack_ffffffffffffefb0);
  iVar1 = DumpReader::getNFrames(in_stack_ffffffffffffed60);
  if (iVar1 < 1) {
    uVar2 = std::__cxx11::string::c_str();
    snprintf(painCave.errMsg,2000,
             "Initial configuration file %s should at least contain one frame\n",uVar2);
    painCave.isFatal = 1;
    simError();
  }
  else {
    DumpReader::readFrame(in_stack_ffffffffffffedf0,in_stack_ffffffffffffedec);
  }
  this_00 = (DumpReader *)SimInfo::getSnapshotManager(in_RSI);
  (*(code *)this_00->info_->simParams_)();
  DumpReader::~DumpReader(this_00);
  return;
}

Assistant:

void SimCreator::loadCoordinates(SimInfo* info,
                                   const std::string& mdFileName) {
    DumpReader reader(info, mdFileName);
    int nframes = reader.getNFrames();

    if (nframes > 0) {
      reader.readFrame(nframes - 1);
    } else {
      // invalid initial coordinate file
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "Initial configuration file %s should at least contain one frame\n",
          mdFileName.c_str());
      painCave.isFatal = 1;
      simError();
    }
    // copy the current snapshot to previous snapshot
    info->getSnapshotManager()->advance();
  }